

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

result_type __thiscall
math::wide_integer::uniform_int_distribution<128u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<128u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  undefined5 extraout_var;
  sbyte sVar4;
  ulong uVar5;
  long lVar6;
  result_type result;
  result_type range;
  uintwide_t<128U,_unsigned_int,_void,_false> local_78;
  uintwide_t<128U,_unsigned_int,_void,_false> local_68;
  uintwide_t<128U,_unsigned_int,_void,_false> local_58;
  array<unsigned_int,_4UL> local_48;
  representation_type local_38;
  
  uVar5 = 0;
  uintwide_t<128u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
  enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std::
  numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::digits),void>::type__
            (&local_78,'\0',
             (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  lVar6 = 0;
  uVar3 = 0;
  while (uVar5 != 0x10) {
    if ((uVar5 & 3) == 0) {
      uVar3 = std::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::operator()
                        (input_generator);
    }
    sVar4 = (sbyte)((int)(uVar5 & 3) << 3);
    puVar1 = (uint *)((long)local_78.values.super_array<unsigned_int,_4UL>.elems + lVar6);
    *puVar1 = *puVar1 | (uVar3 >> sVar4 & 0xff) << sVar4;
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + (ulong)((uVar5 & 3) == 0) * 4;
  }
  local_48.elems = *(value_type_conflict (*) [4])input_params;
  local_68.values.super_array<unsigned_int,_4UL>.elems[0]._0_3_ =
       uintwide_t<128U,_unsigned_int,_void,_false>::limits_helper_min<false>();
  local_68.values.super_array<unsigned_int,_4UL>.elems._3_5_ = extraout_var;
  bVar2 = uintwide_t<128U,_unsigned_int,_void,_false>::operator!=
                    ((uintwide_t<128U,_unsigned_int,_void,_false> *)&local_48,&local_68);
  if (!bVar2) {
    local_58.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
         *(undefined8 *)(input_params[2].param_b.values.super_array<unsigned_char,_3UL>.elems + 1);
    local_58.values.super_array<unsigned_int,_4UL>.elems._8_8_ = *(undefined8 *)(input_params + 4);
    local_38.super_array<unsigned_int,_4UL>.elems =
         (array<unsigned_int,_4UL>)
         uintwide_t<128U,_unsigned_int,_void,_false>::limits_helper_max<false>();
    bVar2 = uintwide_t<128U,_unsigned_int,_void,_false>::operator!=
                      (&local_58,(uintwide_t<128U,_unsigned_int,_void,_false> *)&local_38);
    if (!bVar2) goto LAB_00147d12;
  }
  local_68.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
       *(undefined8 *)(input_params[2].param_b.values.super_array<unsigned_char,_3UL>.elems + 1);
  local_68.values.super_array<unsigned_int,_4UL>.elems._8_8_ = *(undefined8 *)(input_params + 4);
  local_58.values.super_array<unsigned_int,_4UL>.elems._0_8_ = *(undefined8 *)input_params;
  local_58.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
       *(undefined8 *)(input_params[1].param_a.values.super_array<unsigned_char,_3UL>.elems + 2);
  local_48.elems = (value_type_conflict  [4])wide_integer::operator-(&local_68,&local_58);
  uintwide_t<128U,_unsigned_int,_void,_false>::preincrement
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)&local_48);
  uintwide_t<128U,_unsigned_int,_void,_false>::operator%=
            (&local_78,(uintwide_t<24U,_unsigned_char,_void,_false> *)&local_48);
  local_68.values.super_array<unsigned_int,_4UL>.elems._0_8_ = *(undefined8 *)input_params;
  local_68.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
       *(undefined8 *)(input_params[1].param_a.values.super_array<unsigned_char,_3UL>.elems + 2);
  uintwide_t<128U,_unsigned_int,_void,_false>::operator+=(&local_78,&local_68);
LAB_00147d12:
  return (result_type)local_78.values.super_array<unsigned_int,_4UL>.elems[0]._0_3_;
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }